

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O1

LPCSTR __thiscall
NpyArray::LoadNPZ(NpyArray *this,FILE *fp,uint32_t comprBytes,uint32_t uncomprBytes)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  EVP_PKEY_CTX *ctx;
  ulong __n;
  char *pcVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bufferUncompr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bufferCompr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  pointer local_a0;
  uint32_t local_98;
  uint8_t *local_88;
  uint32_t local_80;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  
  __n = (ulong)comprBytes;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_b8,__n,(allocator_type *)&local_a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_d0,(ulong)uncomprBytes,(allocator_type *)&local_a0);
  sVar3 = fread(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,1,__n,(FILE *)fp);
  if (sVar3 == __n) {
    local_98 = 0;
    local_a0 = (pointer)0x0;
    local_60 = 0;
    uStack_58 = 0;
    local_50 = 0;
    iVar1 = inflateInit2_(&local_a0,0xfffffff1,"1.2.11",0x70);
    if (iVar1 == 0) {
      local_a0 = local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_88 = local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_98 = comprBytes;
      local_80 = uncomprBytes;
      uVar2 = inflate(&local_a0,4);
      if (uVar2 < 2) {
        inflateEnd(&local_a0);
        ctx = (EVP_PKEY_CTX *)&this->shape;
        pcVar4 = ParseHeaderNPY(local_d0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,(shape_t *)ctx,
                                &this->wordSize,&this->type,&this->fortranOrder);
        if (pcVar4 == (LPCSTR)0x0) {
          init(this,ctx);
          sVar3 = this->wordSize * this->numValues;
          memcpy(this->data,
                 local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + (uncomprBytes - sVar3),sVar3);
          pcVar4 = (LPCSTR)0x0;
        }
      }
      else {
        pcVar4 = "error: can not uncompress";
      }
    }
    else {
      pcVar4 = "error: can not init inflate";
    }
  }
  else {
    pcVar4 = "error: failed fread";
  }
  if (local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return pcVar4;
}

Assistant:

LPCSTR NpyArray::LoadNPZ(FILE* fp, uint32_t comprBytes, uint32_t uncomprBytes)
{
	std::vector<uint8_t> bufferCompr(comprBytes);
	std::vector<uint8_t> bufferUncompr(uncomprBytes);
	if (fread(bufferCompr.data(), 1, comprBytes, fp) != comprBytes)
		return "error: failed fread";

	z_stream d_stream;
	d_stream.zalloc = Z_NULL;
	d_stream.zfree = Z_NULL;
	d_stream.opaque = Z_NULL;
	d_stream.avail_in = 0;
	d_stream.next_in = Z_NULL;
	int err = inflateInit2(&d_stream, -MAX_WBITS);
	if (err != Z_OK)
		return "error: can not init inflate";

	d_stream.avail_in = comprBytes;
	d_stream.next_in = bufferCompr.data();
	d_stream.avail_out = uncomprBytes;
	d_stream.next_out = bufferUncompr.data();
	err = inflate(&d_stream, Z_FINISH);
	if (err != Z_STREAM_END && err != Z_OK)
		return "error: can not uncompress";

	err = inflateEnd(&d_stream);

	LPCSTR ret = ParseHeaderNPY(bufferUncompr.data(), shape, wordSize, type, fortranOrder);
	if (ret != NULL)
		return ret;
	init();
	const size_t offset = uncomprBytes - SizeBytes();
	memcpy(Data(), bufferUncompr.data()+offset, SizeBytes());
	return NULL;
}